

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printToFile(queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *cl)

{
  int iVar1;
  Node *pNVar2;
  int *piVar3;
  char cVar4;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *pqVar5;
  ostream *poVar6;
  int *piVar7;
  ulong uVar8;
  long local_240;
  ofstream Nodes;
  ios_base local_148 [264];
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *local_40;
  int local_38;
  char local_31;
  
  std::ofstream::ofstream((ostream *)&local_240);
  std::ofstream::open((char *)&local_240,0x105016);
  std::deque<Node_*,_std::allocator<Node_*>_>::pop_front(&cl->c);
  if ((cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    local_38 = 1;
    local_40 = cl;
    do {
      cVar4 = (char)(ostream *)&local_240;
      std::ios::widen((char)*(undefined8 *)(local_240 + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Node number: ",0xd);
      std::ostream::operator<<((ostream *)&local_240,local_38);
      pNVar2 = *(cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      piVar3 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar8 = 0;
      for (piVar7 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
        iVar1 = *piVar7;
        if ((int)(uVar8 / 3) * 3 == (int)uVar8) {
          std::ios::widen((char)*(undefined8 *)(local_240 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_240,iVar1);
        local_31 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      std::ios::widen((char)*(undefined8 *)(local_240 + -0x18) + cVar4);
      pqVar5 = local_40;
      std::ostream::put(cVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Parent: ",8);
      pNVar2 = (*(pqVar5->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur)->parent;
      piVar3 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar7 = (pNVar2->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; cl = local_40, piVar7 != piVar3;
          piVar7 = piVar7 + 1) {
        iVar1 = *piVar7;
        if ((uint)((int)uVar8 * -0x55555555) < 0x55555556) {
          std::ios::widen((char)*(undefined8 *)(local_240 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_240,iVar1);
        local_31 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      std::deque<Node_*,_std::allocator<Node_*>_>::pop_front(&local_40->c);
      local_38 = local_38 + 1;
    } while ((cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (cl->c).super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  std::ofstream::close();
  local_240 = _VTT;
  *(undefined8 *)((long)&local_240 + *(long *)(_VTT + -0x18)) = ___cxa_atexit;
  std::filebuf::~filebuf((filebuf *)&Nodes);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void printToFile(std::queue<Node*> cl) {
  ofstream Nodes;
  Nodes.open("Nodes.txt");
  cl.pop();
  int nodeCount = 1;
  while (!cl.empty()) {
    int count = 0;
    Nodes << std::endl;
    Nodes << "Node number: " << nodeCount;
    for (auto i : cl.front()->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    Nodes << std::endl;
    Nodes << "Parent: ";
    for (auto i : cl.front()->parent->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    cl.pop();
    nodeCount++;
  }
  Nodes.close();
  }